

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

Sym __thiscall covenant::CFG::replaceTerminal(CFG *this,Sym t)

{
  bool bVar1;
  int in_ESI;
  Sym nt;
  Rule *in_stack_ffffffffffffff88;
  Rule *this_00;
  undefined4 in_stack_ffffffffffffffa4;
  CFG *in_stack_ffffffffffffffa8;
  Sym in_stack_ffffffffffffffb4;
  shared_count in_stack_ffffffffffffffb8;
  CFG *in_stack_ffffffffffffffc8;
  Sym local_8;
  int local_4;
  
  local_8.x = in_ESI;
  bVar1 = Sym::isVar(&local_8);
  if (bVar1) {
    local_4 = local_8.x;
  }
  else {
    local_4 = (int)newVar(in_stack_ffffffffffffffc8);
    this_00 = (Rule *)&stack0xffffffffffffffb0;
    boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)this_00,&in_stack_ffffffffffffff88->_tfac);
    Rule::E((TermFactory *)in_stack_ffffffffffffffb8.pi_);
    Rule::operator<<(in_stack_ffffffffffffff88,(Sym)(int)((ulong)this_00 >> 0x20));
    prod(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb4,
         (Rule *)CONCAT44(in_stack_ffffffffffffffa4,local_8.x));
    Rule::~Rule(this_00);
    boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)0x216967);
  }
  return (Sym)local_4;
}

Assistant:

Sym replaceTerminal (Sym t)
    {
      if (t.isVar ()) return t;

      Sym nt = newVar();
      prod (nt, Rule::E(_tfac) << t);
      return nt;
    }